

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScriptGenerator.cxx
# Opt level: O0

void __thiscall
cmScriptGenerator::GenerateScriptActionsOnce(cmScriptGenerator *this,ostream *os,Indent indent)

{
  bool bVar1;
  cmScriptGeneratorIndent cVar2;
  ostream *poVar3;
  undefined1 local_48 [8];
  string config_test;
  ostream *os_local;
  cmScriptGenerator *this_local;
  Indent indent_local;
  
  this_local._4_4_ = indent.Level;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->Configurations);
  if (bVar1) {
    config_test.field_2._12_4_ = this_local._4_4_;
    (*this->_vptr_cmScriptGenerator[4])(this,os,(ulong)(uint)this_local._4_4_);
  }
  else {
    CreateConfigTest((string *)local_48,this,&this->Configurations);
    poVar3 = ::operator<<(os,(cmScriptGeneratorIndent)this_local._4_4_);
    poVar3 = std::operator<<(poVar3,"if(");
    poVar3 = std::operator<<(poVar3,(string *)local_48);
    std::operator<<(poVar3,")\n");
    cVar2 = cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
    (*this->_vptr_cmScriptGenerator[4])(this,os,(ulong)(uint)cVar2.Level);
    poVar3 = ::operator<<(os,(cmScriptGeneratorIndent)this_local._4_4_);
    poVar3 = std::operator<<(poVar3,"endif(");
    poVar3 = std::operator<<(poVar3,(string *)local_48);
    std::operator<<(poVar3,")\n");
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void cmScriptGenerator::GenerateScriptActionsOnce(std::ostream& os,
                                                  Indent indent)
{
  if (this->Configurations.empty()) {
    // This rule is for all configurations.
    this->GenerateScriptActions(os, indent);
  } else {
    // Generate a per-configuration block.
    std::string config_test = this->CreateConfigTest(this->Configurations);
    os << indent << "if(" << config_test << ")\n";
    this->GenerateScriptActions(os, indent.Next());
    os << indent << "endif(" << config_test << ")\n";
  }
}